

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

BaseFab<double> * __thiscall
amrex::BaseFab<double>::plus<(amrex::RunOn)0>
          (BaseFab<double> *this,BaseFab<double> *src,Box bx,SrcComp scomp,DestComp dcomp,
          NumComps ncomp)

{
  undefined4 in_EDX;
  long in_RSI;
  BaseFab<double> *in_RDI;
  Array4<const_double> *s;
  Array4<double> *d;
  undefined1 local_340 [32];
  anon_class_144_4_062952f7 *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffcec;
  Box *in_stack_fffffffffffffcf0;
  undefined1 auStack_2f8 [64];
  undefined4 local_2b8;
  undefined4 local_2ac;
  Array4<const_double> local_2a8;
  Array4<const_double> *local_268;
  Array4<double> local_260;
  Array4<double> *local_220;
  long local_218;
  undefined4 local_1fc;
  undefined4 *local_1f0;
  long local_1e8;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_218 = in_RSI;
  local_1fc = in_EDX;
  Box::operator&=((Box *)&stack0x00000008,(Box *)(in_RSI + 0x18));
  local_a8 = in_RDI->dptr;
  local_b0 = &in_RDI->domain;
  local_b4 = in_RDI->nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (in_RDI->domain).smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (in_RDI->domain).smallend.vect[2];
  local_8 = &(in_RDI->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(in_RDI->domain).bigend;
  local_1c = 1;
  iStack_34 = (in_RDI->domain).bigend.vect[1] + 1;
  local_28 = &(in_RDI->domain).bigend;
  local_2c = 2;
  local_f0.z = (in_RDI->domain).bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_260,local_a8,&local_c0,&local_e0,local_b4);
  local_1e8 = local_218;
  local_198 = *(double **)(local_218 + 0x10);
  local_1a0 = (undefined8 *)(local_218 + 0x18);
  local_1a4 = *(int *)(local_218 + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(local_218 + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(local_218 + 0x20);
  local_f8 = (int *)(local_218 + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = local_218 + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(local_218 + 0x28) + 1;
  local_118 = local_218 + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(local_218 + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_220 = &local_260;
  local_1cc._0_8_ = local_1e0._0_8_;
  local_1cc.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<const_double>::Array4(&local_2a8,local_198,&local_1b0,&local_1cc,local_1a4);
  local_268 = &local_2a8;
  local_2ac = 0;
  local_1f0 = &local_2ac;
  memcpy(local_340,local_220,0x3c);
  memcpy(auStack_2f8,local_268,0x3c);
  local_2b8 = local_1fc;
  LoopConcurrentOnCpu<amrex::BaseFab<double>::plus<(amrex::RunOn)0>(amrex::BaseFab<double>const&,amrex::Box,amrex::SrcComp,amrex::DestComp,amrex::NumComps)::_lambda(int,int,int,int)_1_>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0);
  return in_RDI;
}

Assistant:

BaseFab<T>&
BaseFab<T>::plus (const BaseFab<T>& src, Box bx,
                  SrcComp scomp, DestComp dcomp, NumComps ncomp) noexcept
{
    AMREX_ASSERT(this->domain.sameType(src.domain));
    AMREX_ASSERT(scomp.i >= 0 && scomp.i+ncomp.n <= src.nvar);
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i+ncomp.n <= this->nvar);

    bx &= src.domain;

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, bx, ncomp.n, i, j, k, n,
    {
        d(i,j,k,n+dcomp.i) += s(i,j,k,n+scomp.i);
    });

    return *this;
}